

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void rouse_shk(monst *shkp,boolean verbosely)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  char *pcVar4;
  char *pcVar5;
  boolean verbosely_local;
  monst *shkp_local;
  
  if (((*(uint *)&shkp->field_0x60 >> 0x12 & 1) != 0) &&
     ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) == 0)) {
    return;
  }
  if (verbosely == '\0') goto LAB_002cb24f;
  if (shkp->wormno == '\0') {
    if (((viz_array[shkp->my][shkp->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((shkp->data->mflags3 & 0x200) != 0 && ((viz_array[shkp->my][shkp->mx] & 1U) != 0))))))))
    goto LAB_002cafc3;
LAB_002cb050:
    if (((((shkp->data->mflags1 & 0x10000) != 0) ||
         ((poVar3 = which_armor(shkp,4), poVar3 != (obj *)0x0 &&
          (poVar3 = which_armor(shkp,4), poVar3->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar2 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy), 0x40 < iVar2)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(shkp), bVar1 == '\0')))) goto LAB_002cb24f;
  }
  else {
    bVar1 = worm_known(level,shkp);
    if (bVar1 == '\0') goto LAB_002cb050;
LAB_002cafc3:
    if (((((((*(uint *)&shkp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&shkp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&shkp->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_002cb050;
  }
  pcVar4 = Monnam(shkp);
  pcVar5 = "can move again";
  if ((*(uint *)&shkp->field_0x60 >> 0x13 & 1) != 0) {
    pcVar5 = "wakes up";
  }
  pline("%s %s.",pcVar4,pcVar5);
LAB_002cb24f:
  *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfff7ffff;
  shkp->mfrozen = '\0';
  *(uint *)&shkp->field_0x60 = *(uint *)&shkp->field_0x60 & 0xfffbffff | 0x40000;
  return;
}

Assistant:

static void rouse_shk(struct monst *shkp, boolean verbosely)
{
	if (!shkp->mcanmove || shkp->msleeping) {
	    /* greed induced recovery... */
	    if (verbosely && canspotmon(level, shkp))
		pline("%s %s.", Monnam(shkp),
		      shkp->msleeping ? "wakes up" : "can move again");
	    shkp->msleeping = 0;
	    shkp->mfrozen = 0;
	    shkp->mcanmove = 1;
	}
}